

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O1

void __thiscall chrono::viper::ViperDCMotorControl::Update(ViperDCMotorControl *this,double time)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  Viper *pVVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  double dVar8;
  
  pVVar4 = (this->super_ViperDriver).viper;
  lVar6 = 0;
  do {
    lVar5 = *(long *)((long)&(pVVar4->m_drive_shafts)._M_elems[0].
                             super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + lVar6 * 2);
    dVar1 = *(double *)(lVar5 + 0x90);
    dVar2 = *(double *)((long)(this->m_no_load_speed)._M_elems + lVar6);
    dVar8 = 0.0;
    if (-dVar1 <= dVar2) {
      if (dVar1 <= 0.0) {
        dVar8 = ((dVar1 + dVar2) / dVar2) *
                *(double *)((long)(this->m_stall_torque)._M_elems + lVar6);
      }
      else {
        dVar8 = *(double *)((long)(this->m_stall_torque)._M_elems + lVar6);
      }
    }
    auVar7._0_8_ = -dVar8;
    auVar7._8_8_ = 0x8000000000000000;
    uVar3 = vmovlpd_avx(auVar7);
    *(undefined8 *)(lVar5 + 0x80) = uVar3;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  return;
}

Assistant:

void ViperDCMotorControl::Update(double time) {
    double speed_reading;
    double target_torque;
    for (int i = 0; i < 4; i++) {
        speed_reading = -viper->m_drive_shafts[i]->GetPos_dt();

        if (speed_reading > m_no_load_speed[i]) {
            target_torque = 0;
        } else if (speed_reading < 0) {
            target_torque = m_stall_torque[i];
        } else {
            target_torque = m_stall_torque[i] * ((m_no_load_speed[i] - speed_reading) / m_no_load_speed[i]);
        }

        viper->m_drive_shafts[i]->SetAppliedTorque(-target_torque);
    }
}